

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O0

void __thiscall tt::net::EventLoopThread::threadFunc(EventLoopThread *this)

{
  MutexLockGuard local_98;
  MutexLockGuard lock;
  EventLoop loop;
  EventLoopThread *this_local;
  
  EventLoop::EventLoop((EventLoop *)&lock);
  MutexLockGuard::MutexLockGuard(&local_98,&this->m_mutex);
  this->m_loop = (EventLoop *)&lock;
  Condition::notify(&this->m_cond);
  MutexLockGuard::~MutexLockGuard(&local_98);
  EventLoop::loop((EventLoop *)&lock);
  this->m_loop = (EventLoop *)0x0;
  EventLoop::~EventLoop((EventLoop *)&lock);
  return;
}

Assistant:

void EventLoopThread::threadFunc(){

	EventLoop loop;

	{
		MutexLockGuard lock(m_mutex);
		m_loop = &loop;
		m_cond.notify();
	}

	loop.loop();
	m_loop = NULL;
}